

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraKateGenerator::WriteTargets
          (cmExtraKateGenerator *this,cmLocalGenerator *lg,cmGeneratedFileStream *fout)

{
  cmMakefile *pcVar1;
  cmGlobalGenerator *pcVar2;
  pointer puVar3;
  cmLocalGenerator *this_00;
  pointer pcVar4;
  pointer puVar5;
  int iVar6;
  TargetType TVar7;
  string *make;
  string *makeArgs;
  string *path;
  ostream *poVar8;
  string *psVar9;
  cmValue cVar10;
  char *pcVar11;
  pointer puVar12;
  pointer puVar13;
  bool bVar14;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objectFileTargets;
  string currentDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string fastTarget;
  
  pcVar1 = lg->Makefile;
  objectFileTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&objectFileTargets.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&objectFileTargets,"CMAKE_MAKE_PROGRAM","");
  make = cmMakefile::GetRequiredDefinition(pcVar1,(string *)&objectFileTargets);
  if (objectFileTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&objectFileTargets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(objectFileTargets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((objectFileTargets.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  objectFileTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&objectFileTargets.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&objectFileTargets,"CMAKE_KATE_MAKE_ARGUMENTS","");
  makeArgs = cmMakefile::GetSafeDefinition(pcVar1,(string *)&objectFileTargets);
  if (objectFileTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&objectFileTargets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(objectFileTargets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((objectFileTargets.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  path = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configs,pcVar1,IncludeEmptyConfig);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,"\t\"build\": {\n\t\t\"directory\": \"",0x1c);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"\",\n\t\t\"default_target\": \"all\",\n\t\t\"clean_target\": \"clean\",\n",0x39
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\"build\": \"",0xc);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,(make->_M_dataplus)._M_p,make->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," -C \\\"",6);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\\\" ",3);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(makeArgs->_M_dataplus)._M_p,makeArgs->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"all\",\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\"clean\": \"",0xc);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,(make->_M_dataplus)._M_p,make->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," -C \\\"",6);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\\\" ",3);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(makeArgs->_M_dataplus)._M_p,makeArgs->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"clean\",\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\"quick\": \"",0xc);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,(make->_M_dataplus)._M_p,make->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," -C \\\"",6);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\\\" ",3);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(makeArgs->_M_dataplus)._M_p,makeArgs->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"install\",\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\"targets\":[\n",0xe);
  objectFileTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&objectFileTargets.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&objectFileTargets,"all","");
  AppendTarget(this,fout,(string *)&objectFileTargets,&configs,make,makeArgs,path,path);
  if (objectFileTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&objectFileTargets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(objectFileTargets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((objectFileTargets.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  objectFileTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&objectFileTargets.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&objectFileTargets,"clean","");
  AppendTarget(this,fout,(string *)&objectFileTargets,&configs,make,makeArgs,path,path);
  if (objectFileTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&objectFileTargets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(objectFileTargets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((objectFileTargets.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  puVar12 = (pcVar2->LocalGenerators).
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (pcVar2->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar12 != puVar3) {
    do {
      this_00 = (puVar12->_M_t).
                super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t
                .super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      psVar9 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
      pcVar4 = (psVar9->_M_dataplus)._M_p;
      currentDir._M_dataplus._M_p = (pointer)&currentDir.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&currentDir,pcVar4,pcVar4 + psVar9->_M_string_length);
      psVar9 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                         ((puVar12->_M_t).
                          super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                          .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
      if (currentDir._M_string_length == psVar9->_M_string_length) {
        if (currentDir._M_string_length == 0) {
          bVar14 = true;
        }
        else {
          iVar6 = bcmp(currentDir._M_dataplus._M_p,(psVar9->_M_dataplus)._M_p,
                       currentDir._M_string_length);
          bVar14 = iVar6 == 0;
        }
      }
      else {
        bVar14 = false;
      }
      puVar5 = *(pointer *)
                ((long)&(this_00->GeneratorTargets).
                        super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                + 8);
      for (puVar13 = (this_00->GeneratorTargets).
                     super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar5;
          puVar13 = puVar13 + 1) {
        psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                           ((puVar13->_M_t).
                            super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                            .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        TVar7 = cmGeneratorTarget::GetType
                          ((puVar13->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        if (TVar7 < UTILITY) {
          AppendTarget(this,fout,psVar9,&configs,make,makeArgs,&currentDir,path);
          if (this->UseNinja == false) {
            objectFileTargets.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar9->_M_dataplus)._M_p;
            objectFileTargets.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar9->_M_string_length;
            objectFileTargets.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            views._M_len = 2;
            views._M_array = (iterator)&objectFileTargets;
            cmCatViews(&fastTarget,views);
            AppendTarget(this,fout,&fastTarget,&configs,make,makeArgs,&currentDir,path);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fastTarget._M_dataplus._M_p != &fastTarget.field_2) {
              operator_delete(fastTarget._M_dataplus._M_p,
                              fastTarget.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else if (TVar7 == UTILITY) {
          objectFileTargets.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar9->_M_dataplus)._M_p;
          objectFileTargets.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar9->_M_string_length;
          __str._M_str = "Nightly";
          __str._M_len = 7;
          iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)&objectFileTargets,
                             0,7,__str);
          if ((iVar6 != 0) || (iVar6 = std::__cxx11::string::compare((char *)psVar9), iVar6 == 0)) {
            objectFileTargets.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar9->_M_dataplus)._M_p;
            objectFileTargets.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar9->_M_string_length;
            __str_00._M_str = "Continuous";
            __str_00._M_len = 10;
            iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               &objectFileTargets,0,10,__str_00);
            if ((iVar6 != 0) || (iVar6 = std::__cxx11::string::compare((char *)psVar9), iVar6 == 0))
            {
              objectFileTargets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar9->_M_dataplus)._M_p;
              objectFileTargets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar9->_M_string_length;
              __str_01._M_str = "Experimental";
              __str_01._M_len = 0xc;
              iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 &objectFileTargets,0,0xc,__str_01);
              if ((iVar6 != 0) ||
                 (iVar6 = std::__cxx11::string::compare((char *)psVar9), iVar6 == 0)) {
                AppendTarget(this,fout,psVar9,&configs,make,makeArgs,&currentDir,path);
              }
            }
          }
        }
        else if ((TVar7 == GLOBAL_TARGET) && (bVar14)) {
          iVar6 = std::__cxx11::string::compare((char *)psVar9);
          if (iVar6 == 0) {
            pcVar1 = ((puVar12->_M_t).
                      super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                      .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
            objectFileTargets.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&objectFileTargets.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&objectFileTargets,"CMAKE_EDIT_COMMAND","");
            cVar10 = cmMakefile::GetDefinition(pcVar1,(string *)&objectFileTargets);
            if (objectFileTargets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pointer)&objectFileTargets.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(objectFileTargets.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (ulong)((long)&((objectFileTargets.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                             _M_dataplus)._M_p + 1));
            }
            if ((cVar10.Value == (string *)0x0) ||
               (pcVar11 = strstr(((cVar10.Value)->_M_dataplus)._M_p,"ccmake"),
               pcVar11 != (char *)0x0)) goto LAB_0044459c;
          }
          AppendTarget(this,fout,psVar9,&configs,make,makeArgs,&currentDir,path);
        }
LAB_0044459c:
      }
      objectFileTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      objectFileTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      objectFileTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&objectFileTargets);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)currentDir._M_dataplus._M_p != &currentDir.field_2) {
        operator_delete(currentDir._M_dataplus._M_p,currentDir.field_2._M_allocated_capacity + 1);
      }
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t] }\n",5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configs);
  return;
}

Assistant:

void cmExtraKateGenerator::WriteTargets(const cmLocalGenerator& lg,
                                        cmGeneratedFileStream& fout) const
{
  cmMakefile const* mf = lg.GetMakefile();
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string& makeArgs =
    mf->GetSafeDefinition("CMAKE_KATE_MAKE_ARGUMENTS");
  std::string const& homeOutputDir = lg.GetBinaryDirectory();
  const auto configs = mf->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  /* clang-format off */
  fout <<
  "\t\"build\": {\n"
  "\t\t\"directory\": \"" << homeOutputDir << "\",\n"
  "\t\t\"default_target\": \"all\",\n"
  "\t\t\"clean_target\": \"clean\",\n";
  /* clang-format on */

  // build, clean and quick are for the build plugin kate <= 4.12:
  fout << "\t\t\"build\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "all\",\n";
  fout << "\t\t\"clean\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "clean\",\n";
  fout << "\t\t\"quick\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "install\",\n";

  // this is for kate >= 4.13:
  fout << "\t\t\"targets\":[\n";

  this->AppendTarget(fout, "all", configs, make, makeArgs, homeOutputDir,
                     homeOutputDir);
  this->AppendTarget(fout, "clean", configs, make, makeArgs, homeOutputDir,
                     homeOutputDir);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (const auto& localGen : this->GlobalGenerator->GetLocalGenerators()) {
    const auto& targets = localGen->GetGeneratorTargets();
    const std::string currentDir = localGen->GetCurrentBinaryDirectory();
    bool topLevel = (currentDir == localGen->GetBinaryDirectory());

    for (const auto& target : targets) {
      std::string const& targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          bool insertTarget = false;
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (topLevel) {
            insertTarget = true;
            // only add the "edit_cache" target if it's not ccmake, because
            // this will not work within the IDE
            if (targetName == "edit_cache") {
              cmValue editCommand =
                localGen->GetMakefile()->GetDefinition("CMAKE_EDIT_COMMAND");
              if (!editCommand ||
                  strstr(editCommand->c_str(), "ccmake") != nullptr) {
                insertTarget = false;
              }
            }
          }
          if (insertTarget) {
            this->AppendTarget(fout, targetName, configs, make, makeArgs,
                               currentDir, homeOutputDir);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if ((cmHasLiteralPrefix(targetName, "Nightly") &&
               (targetName != "Nightly")) ||
              (cmHasLiteralPrefix(targetName, "Continuous") &&
               (targetName != "Continuous")) ||
              (cmHasLiteralPrefix(targetName, "Experimental") &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(fout, targetName, configs, make, makeArgs,
                             currentDir, homeOutputDir);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          this->AppendTarget(fout, targetName, configs, make, makeArgs,
                             currentDir, homeOutputDir);
          if (!this->UseNinja) {
            std::string fastTarget = cmStrCat(targetName, "/fast");
            this->AppendTarget(fout, fastTarget, configs, make, makeArgs,
                               currentDir, homeOutputDir);
          }

        } break;
        default:
          break;
      }
    }

    // insert rules for compiling, preprocessing and assembling individual
    // files
    std::vector<std::string> objectFileTargets;
    localGen->GetIndividualFileTargets(objectFileTargets);
    for (std::string const& f : objectFileTargets) {
      this->AppendTarget(fout, f, configs, make, makeArgs, currentDir,
                         homeOutputDir);
    }
  }

  fout << "\t] }\n";
}